

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reaction.cpp
# Opt level: O0

void __thiscall Bind::Bind(Bind *this,double rate_constant,double volume,string *promoter_name)

{
  runtime_error *this_00;
  string *promoter_name_local;
  double volume_local;
  double rate_constant_local;
  Bind *this_local;
  
  Reaction::Reaction(&this->super_Reaction);
  (this->super_Reaction)._vptr_Reaction = (_func_int **)&PTR___cxa_pure_virtual_002aa820;
  this->rate_constant_ = rate_constant;
  std::__cxx11::string::string((string *)&this->promoter_name_,(string *)promoter_name);
  (this->super_Reaction).old_prop_ = 0.0;
  if (volume <= 0.0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Reaction volume cannot be zero.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Bind::Bind(double rate_constant, double volume,
           const std::string &promoter_name)
    : rate_constant_(rate_constant), promoter_name_(promoter_name) {
  old_prop_ = 0;
  // Check volume
  if (volume <= 0) {
    throw std::runtime_error("Reaction volume cannot be zero.");
  }
}